

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  void *__s;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  run_container_t *run;
  long lVar7;
  bool bVar8;
  void *local_80;
  ulong local_70;
  long local_68;
  
  lVar7 = 0;
  uVar5 = 0;
  lVar6 = 0;
  bVar8 = false;
  local_68 = 0;
  local_80 = (void *)0x0;
  local_70 = 0;
  uVar4 = 0;
  do {
    if (ra->size <= lVar7) break;
    run = (run_container_t *)ra->containers[lVar7];
    uVar2 = ra->typecodes[lVar7];
    if (uVar2 == '\x04') {
      ra->typecodes[lVar7] = *(uint8_t *)&run->runs;
      run = *(run_container_t **)run;
      uVar2 = ra->typecodes[lVar7];
    }
    if (uVar2 == '\x03') {
      iVar3 = run_container_cardinality(run);
      lVar6 = (long)iVar3;
    }
    else if ((uVar2 == '\x02') || (uVar2 == '\x01')) {
      lVar6 = (long)run->n_runs;
    }
    uVar1 = uVar5;
    if (uVar4 < limit + offset && offset <= (lVar6 + uVar4) - 1) {
      if (!bVar8) {
        local_68 = offset - uVar4;
        local_70 = local_68 + limit;
        local_80 = roaring_malloc(local_70 * 4);
        if (local_80 == (void *)0x0) {
          return false;
        }
        memset(local_80,0,local_70 * 4);
      }
      uVar1 = lVar6 + uVar5;
      if (local_70 < uVar1) {
        local_70 = local_70 + lVar6;
        __s = roaring_malloc(local_70 * 4);
        if (__s == (void *)0x0) {
          if (local_80 != (void *)0x0) {
            roaring_free(local_80);
          }
          return false;
        }
        memset(__s,0,local_70 * 4);
        memcpy(__s,local_80,uVar5 * 4);
        roaring_free(local_80);
        local_80 = __s;
      }
      bVar8 = true;
      if ((byte)(ra->typecodes[lVar7] - 1) < 3) {
        container_to_uint32_array
                  ((uint32_t *)((long)local_80 + uVar5 * 4),run,ra->typecodes[lVar7],
                   (uint)ra->keys[lVar7] << 0x10);
      }
    }
    uVar5 = uVar1;
    uVar4 = uVar4 + lVar6;
    lVar7 = lVar7 + 1;
  } while (uVar5 - local_68 < limit);
  if (local_80 != (void *)0x0) {
    memcpy(ans,(void *)((long)local_80 + local_68 * 4),limit << 2);
    free(local_80);
  }
  return true;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset,
                           size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {
        const container_t *c =
            container_unwrap_shared(ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit) {
            if (!first) {
                // first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)roaring_malloc(sizeof(*t_ans) *
                                                   (first_skip + limit));
                if (t_ans == NULL) {
                    return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit));
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len) {
                uint32_t *append_ans = (uint32_t *)roaring_malloc(
                    sizeof(*append_ans) * (cur_len + t_limit));
                if (append_ans == NULL) {
                    if (t_ans != NULL) roaring_free(t_ans);
                    return false;
                }
                memset(append_ans, 0,
                       sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                roaring_free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_bitset(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_array(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_run(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr - first_skip >= limit) break;
    }
    if (t_ans != NULL) {
        memcpy(ans, t_ans + first_skip, limit * sizeof(uint32_t));
        free(t_ans);
    }
    return true;
}